

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_hash_name(TextReader *this,FNV1a *value)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  string str;
  string local_60;
  string local_40;
  
  pcVar1 = this->cur_;
  bVar2 = read_hash(this,value);
  bVar3 = true;
  if (!bVar2) {
    this->cur_ = pcVar1;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    bVar3 = read_name(this,&local_60);
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_40,&local_60);
      FNV1a::operator=(value,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  return bVar3;
}

Assistant:

bool read_hash_name(FNV1a& value) noexcept {
            auto const backup = cur_;
            if (read_hash(value)) {
                return true;
            }
            cur_ = backup;
            if (std::string str; read_name(str)) {
                value = { str };
                return true;
            }
            return false;
        }